

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaemonClient.cpp
# Opt level: O0

void __thiscall xmrig::DaemonClient::setState(DaemonClient *this,SocketState state)

{
  unsigned_long *puVar1;
  int in_ESI;
  Timer *in_RDI;
  uint64_t interval;
  undefined4 in_stack_ffffffffffffffc8;
  uint64_t local_28;
  unsigned_long local_20;
  unsigned_long local_18;
  
  if (*(int *)&in_RDI[0x1e].m_timer != in_ESI) {
    *(int *)&in_RDI[0x1e].m_timer = in_ESI;
    if (in_ESI == 0) {
      in_RDI[2].m_listener = (ITimerListener *)0xffffffffffffffff;
      Timer::stop((Timer *)0x1ea3aa);
    }
    else if (in_ESI == 3) {
      in_RDI[2].m_listener = (ITimerListener *)0x0;
      (*(in_RDI[1].m_listener)->_vptr_ITimerListener[5])();
      local_20 = 0x14;
      local_28 = Pool::pollInterval((Pool *)(in_RDI + 0x13));
      puVar1 = std::max<unsigned_long>(&local_20,&local_28);
      local_18 = *puVar1;
      Timer::start(in_RDI,CONCAT44(in_ESI,in_stack_ffffffffffffffc8),0x1ea38f);
    }
  }
  return;
}

Assistant:

void xmrig::DaemonClient::setState(SocketState state)
{
    assert(m_state != state);
    if (m_state == state) {
        return;
    }

    m_state = state;

    switch (state) {
    case ConnectedState:
        {
            m_failures = 0;
            m_listener->onLoginSuccess(this);

            const uint64_t interval = std::max<uint64_t>(20, m_pool.pollInterval());
            m_timer->start(interval, interval);
        }
        break;

    case UnconnectedState:
        m_failures = -1;
        m_timer->stop();
        break;

    default:
        break;
    }
}